

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketFactory.h
# Opt level: O1

void __thiscall
gmlc::networking::SocketFactory::SocketFactory(SocketFactory *this,string *conf,bool is_file)

{
  pointer pcVar1;
  undefined7 in_register_00000011;
  _Alloc_hider _Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  string local_58;
  string local_38;
  
  (this->super_enable_shared_from_this<gmlc::networking::SocketFactory>)._M_weak_this.
  super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_enable_shared_from_this<gmlc::networking::SocketFactory>)._M_weak_this.
  super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->encrypted = false;
  this->handshake_server = false;
  if ((int)CONCAT71(in_register_00000011,is_file) == 0) {
    paVar3 = &local_58.field_2;
    pcVar1 = (conf->_M_dataplus)._M_p;
    local_58._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,pcVar1,pcVar1 + conf->_M_string_length);
    parse_json_config(this,&local_58);
    _Var2._M_p = local_58._M_dataplus._M_p;
  }
  else {
    paVar3 = &local_38.field_2;
    pcVar1 = (conf->_M_dataplus)._M_p;
    local_38._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_38,pcVar1,pcVar1 + conf->_M_string_length);
    load_json_config_file(this,&local_38);
    _Var2._M_p = local_38._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var2._M_p != paVar3) {
    operator_delete(_Var2._M_p,paVar3->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

SocketFactory(const std::string& conf, bool is_file = true)
    {
        if (is_file) {
            load_json_config_file(conf);
        } else {
            parse_json_config(conf);
        }
    }